

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

CURLcode cf_cntrl_all(connectdata *conn,Curl_easy *data,_Bool ignore_result,int event,int arg1,
                     void *arg2)

{
  ulong local_40;
  size_t i;
  CURLcode result;
  void *arg2_local;
  int arg1_local;
  int event_local;
  _Bool ignore_result_local;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  i._4_4_ = CURLE_OK;
  local_40 = 0;
  while ((local_40 < 2 &&
         ((i._4_4_ = Curl_conn_cf_cntrl(conn->cfilter[local_40],data,ignore_result,event,arg1,arg2),
          ignore_result || (i._4_4_ == CURLE_OK))))) {
    local_40 = local_40 + 1;
  }
  return i._4_4_;
}

Assistant:

static CURLcode cf_cntrl_all(struct connectdata *conn,
                             struct Curl_easy *data,
                             bool ignore_result,
                             int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  size_t i;

  for(i = 0; i < CURL_ARRAYSIZE(conn->cfilter); ++i) {
    result = Curl_conn_cf_cntrl(conn->cfilter[i], data, ignore_result,
                                event, arg1, arg2);
    if(!ignore_result && result)
      break;
  }
  return result;
}